

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

int xc_func_find_ext_params_name(xc_func_type *p,char *name)

{
  int iVar1;
  xc_func_info_type *pxVar2;
  int iVar3;
  long lVar4;
  
  pxVar2 = p->info;
  iVar1 = (pxVar2->ext_params).n;
  lVar4 = 0;
  while( true ) {
    if (iVar1 <= lVar4) {
      return -1;
    }
    iVar3 = strcmp((pxVar2->ext_params).names[lVar4],name);
    if (iVar3 == 0) break;
    lVar4 = lVar4 + 1;
  }
  return (int)lVar4;
}

Assistant:

static int
xc_func_find_ext_params_name(const xc_func_type *p, const char *name) {
  int ii;
  assert(p != NULL && p->info->ext_params.n > 0);
  for(ii=0; ii<p->info->ext_params.n; ii++){
    if(strcmp(p->info->ext_params.names[ii], name) == 0) {
      return ii;
    }
  }
  return -1;
}